

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool CheckWitnessMalleation
               (CBlock *block,bool expect_witness_commitment,BlockValidationState *state)

{
  bool bVar1;
  element_type *peVar2;
  pointer pCVar3;
  char *pcVar4;
  pointer pCVar5;
  long *plVar6;
  undefined8 *puVar7;
  uchar *data;
  pointer psVar8;
  undefined1 *puVar9;
  size_type *psVar10;
  long lVar11;
  byte unaff_BPL;
  undefined7 in_register_00000031;
  long lVar12;
  ulong uVar13;
  int iVar14;
  pointer psVar16;
  byte bVar17;
  long in_FS_OFFSET;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Span<unsigned_char> output;
  uint256 hash_witness;
  string local_e8;
  undefined1 local_c8 [32];
  uchar local_a8 [80];
  string local_58;
  long local_38;
  ulong uVar15;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000031,expect_witness_commitment) != 0) {
    bVar17 = 1;
    if (block->m_checked_witness_commitment != false) goto LAB_00b128ce;
    psVar16 = (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar15 = 0xffffffff;
    iVar14 = -1;
    if (psVar16 !=
        (block->vtx).
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      peVar2 = (psVar16->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar12 = (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar3;
      if (lVar12 != 0) {
        lVar12 = (lVar12 >> 3) * -0x3333333333333333;
        psVar10 = (size_type *)((long)&pCVar3->scriptPubKey + 0x1c);
        uVar13 = 0;
        do {
          if (((((0x42 < *psVar10) &&
                (pcVar4 = *(char **)&((CScriptBase *)(psVar10 + -7))->_union, *pcVar4 == 'j')) &&
               (pcVar4[1] == '$')) && ((pcVar4[2] == -0x56 && (pcVar4[3] == '!')))) &&
             ((pcVar4[4] == -0x57 && (pcVar4[5] == -0x13)))) {
            uVar15 = uVar13 & 0xffffffff;
          }
          iVar14 = (int)uVar15;
          uVar13 = uVar13 + 1;
          psVar10 = psVar10 + 10;
        } while (lVar12 + (ulong)(lVar12 == 0) != uVar13);
      }
    }
    if (iVar14 != -1) {
      if ((psVar16 ==
           (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         (peVar2 = (psVar16->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr,
         pCVar5 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start,
         pCVar5 == (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish)) {
        __assert_fail("!block.vtx.empty() && !block.vtx[0]->vin.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0xf76,
                      "bool CheckWitnessMalleation(const CBlock &, bool, BlockValidationState &)");
      }
      plVar6 = (long *)(pCVar5->scriptWitness).stack.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      if (((long)*(pointer *)
                  ((long)&(pCVar5->scriptWitness).stack.
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_impl.super__Vector_impl_data + 8) - (long)plVar6 == 0x18) &&
         (plVar6[1] - *plVar6 == 0x20)) {
        BlockWitnessMerkleRoot((uint256 *)&local_58,block,(bool *)0x0);
        local_a8[0x30] = '\0';
        local_a8[0x31] = '\0';
        local_a8[0x32] = '\0';
        local_a8[0x33] = '\0';
        local_a8[0x34] = '\0';
        local_a8[0x35] = '\0';
        local_a8[0x36] = '\0';
        local_a8[0x37] = '\0';
        local_a8[0x38] = '\0';
        local_a8[0x39] = '\0';
        local_a8[0x3a] = '\0';
        local_a8[0x3b] = '\0';
        local_a8[0x3c] = '\0';
        local_a8[0x3d] = '\0';
        local_a8[0x3e] = '\0';
        local_a8[0x3f] = '\0';
        local_a8[0x20] = '\0';
        local_a8[0x21] = '\0';
        local_a8[0x22] = '\0';
        local_a8[0x23] = '\0';
        local_a8[0x24] = '\0';
        local_a8[0x25] = '\0';
        local_a8[0x26] = '\0';
        local_a8[0x27] = '\0';
        local_a8[0x28] = '\0';
        local_a8[0x29] = '\0';
        local_a8[0x2a] = '\0';
        local_a8[0x2b] = '\0';
        local_a8[0x2c] = '\0';
        local_a8[0x2d] = '\0';
        local_a8[0x2e] = '\0';
        local_a8[0x2f] = '\0';
        local_a8[0x10] = '\0';
        local_a8[0x11] = '\0';
        local_a8[0x12] = '\0';
        local_a8[0x13] = '\0';
        local_a8[0x14] = '\0';
        local_a8[0x15] = '\0';
        local_a8[0x16] = '\0';
        local_a8[0x17] = '\0';
        local_a8[0x18] = '\0';
        local_a8[0x19] = '\0';
        local_a8[0x1a] = '\0';
        local_a8[0x1b] = '\0';
        local_a8[0x1c] = '\0';
        local_a8[0x1d] = '\0';
        local_a8[0x1e] = '\0';
        local_a8[0x1f] = '\0';
        local_a8[0] = '\0';
        local_a8[1] = '\0';
        local_a8[2] = '\0';
        local_a8[3] = '\0';
        local_a8[4] = '\0';
        local_a8[5] = '\0';
        local_a8[6] = '\0';
        local_a8[7] = '\0';
        local_a8[8] = '\0';
        local_a8[9] = '\0';
        local_a8[10] = '\0';
        local_a8[0xb] = '\0';
        local_a8[0xc] = '\0';
        local_a8[0xd] = '\0';
        local_a8[0xe] = '\0';
        local_a8[0xf] = '\0';
        local_c8._16_8_ = 0;
        local_c8._24_4_ = 0;
        local_c8._28_4_ = 0;
        local_c8._0_8_ = (pointer)0x0;
        local_c8._8_8_ = 0;
        local_a8[0x40] = '\0';
        local_a8[0x41] = '\0';
        local_a8[0x42] = '\0';
        local_a8[0x43] = '\0';
        local_a8[0x44] = '\0';
        local_a8[0x45] = '\0';
        local_a8[0x46] = '\0';
        local_a8[0x47] = '\0';
        CSHA256::CSHA256((CSHA256 *)local_c8);
        CSHA256::Write((CSHA256 *)local_c8,(uchar *)&local_58,0x20);
        puVar7 = (undefined8 *)
                 (pCVar5->scriptWitness).stack.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        data = (uchar *)*puVar7;
        CSHA256::Write((CSHA256 *)local_c8,data,puVar7[1] - (long)data);
        output.m_size = 0x20;
        output.m_data = (uchar *)&local_58;
        CHash256::Finalize((CHash256 *)local_c8,output);
        lVar11 = (long)iVar14;
        lVar12 = *(long *)&(((((block->vtx).
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>;
        if (*(uint *)(lVar12 + 0x24 + lVar11 * 0x28) < 0x1d) {
          lVar12 = lVar12 + lVar11 * 0x28 + 8;
        }
        else {
          lVar12 = *(long *)(lVar12 + 8 + lVar11 * 0x28);
        }
        auVar19[0] = -(*(char *)(lVar12 + 6) == (char)local_58._M_dataplus._M_p);
        auVar19[1] = -(*(char *)(lVar12 + 7) == local_58._M_dataplus._M_p._1_1_);
        auVar19[2] = -(*(char *)(lVar12 + 8) == local_58._M_dataplus._M_p._2_1_);
        auVar19[3] = -(*(char *)(lVar12 + 9) == local_58._M_dataplus._M_p._3_1_);
        auVar19[4] = -(*(char *)(lVar12 + 10) == local_58._M_dataplus._M_p._4_1_);
        auVar19[5] = -(*(char *)(lVar12 + 0xb) == local_58._M_dataplus._M_p._5_1_);
        auVar19[6] = -(*(char *)(lVar12 + 0xc) == local_58._M_dataplus._M_p._6_1_);
        auVar19[7] = -(*(char *)(lVar12 + 0xd) == local_58._M_dataplus._M_p._7_1_);
        auVar19[8] = -(*(char *)(lVar12 + 0xe) == (char)local_58._M_string_length);
        auVar19[9] = -(*(char *)(lVar12 + 0xf) == local_58._M_string_length._1_1_);
        auVar19[10] = -(*(char *)(lVar12 + 0x10) == local_58._M_string_length._2_1_);
        auVar19[0xb] = -(*(char *)(lVar12 + 0x11) == local_58._M_string_length._3_1_);
        auVar19[0xc] = -(*(char *)(lVar12 + 0x12) == local_58._M_string_length._4_1_);
        auVar19[0xd] = -(*(char *)(lVar12 + 0x13) == local_58._M_string_length._5_1_);
        auVar19[0xe] = -(*(char *)(lVar12 + 0x14) == local_58._M_string_length._6_1_);
        auVar19[0xf] = -(*(char *)(lVar12 + 0x15) == local_58._M_string_length._7_1_);
        auVar18[0] = -(*(char *)(lVar12 + 0x16) == (char)local_58.field_2._M_allocated_capacity);
        auVar18[1] = -(*(char *)(lVar12 + 0x17) == (char)((ulong)local_58.field_2._0_8_ >> 8));
        auVar18[2] = -(*(char *)(lVar12 + 0x18) == (char)((ulong)local_58.field_2._0_8_ >> 0x10));
        auVar18[3] = -(*(char *)(lVar12 + 0x19) == (char)((ulong)local_58.field_2._0_8_ >> 0x18));
        auVar18[4] = -(*(char *)(lVar12 + 0x1a) == (char)((ulong)local_58.field_2._0_8_ >> 0x20));
        auVar18[5] = -(*(char *)(lVar12 + 0x1b) == (char)((ulong)local_58.field_2._0_8_ >> 0x28));
        auVar18[6] = -(*(char *)(lVar12 + 0x1c) == (char)((ulong)local_58.field_2._0_8_ >> 0x30));
        auVar18[7] = -(*(char *)(lVar12 + 0x1d) == (char)((ulong)local_58.field_2._0_8_ >> 0x38));
        auVar18[8] = -(*(char *)(lVar12 + 0x1e) == (char)local_58.field_2._8_8_);
        auVar18[9] = -(*(char *)(lVar12 + 0x1f) == (char)((ulong)local_58.field_2._8_8_ >> 8));
        auVar18[10] = -(*(char *)(lVar12 + 0x20) == (char)((ulong)local_58.field_2._8_8_ >> 0x10));
        auVar18[0xb] = -(*(char *)(lVar12 + 0x21) == (char)((ulong)local_58.field_2._8_8_ >> 0x18));
        auVar18[0xc] = -(*(char *)(lVar12 + 0x22) == (char)((ulong)local_58.field_2._8_8_ >> 0x20));
        auVar18[0xd] = -(*(char *)(lVar12 + 0x23) == (char)((ulong)local_58.field_2._8_8_ >> 0x28));
        auVar18[0xe] = -(*(char *)(lVar12 + 0x24) == (char)((ulong)local_58.field_2._8_8_ >> 0x30));
        auVar18[0xf] = -(*(char *)(lVar12 + 0x25) == (char)((ulong)local_58.field_2._8_8_ >> 0x38));
        auVar18 = auVar18 & auVar19;
        if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) {
          block->m_checked_witness_commitment = true;
          unaff_BPL = 1;
          goto LAB_00b127eb;
        }
        local_c8._0_8_ = local_c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c8,"bad-witness-merkle-match","");
        tinyformat::format<char[23]>
                  (&local_e8,"%s : witness merkle commitment mismatch",
                   (char (*) [23])"CheckWitnessMalleation");
        unaff_BPL = ValidationState<BlockValidationResult>::Invalid
                              (&state->super_ValidationState<BlockValidationResult>,BLOCK_MUTATED,
                               (string *)local_c8,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) goto LAB_00b127ca;
      }
      else {
        local_c8._0_8_ = local_c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c8,"bad-witness-nonce-size","");
        tinyformat::format<char[23]>
                  (&local_58,"%s : invalid witness reserved value size",
                   (char (*) [23])"CheckWitnessMalleation");
        unaff_BPL = ValidationState<BlockValidationResult>::Invalid
                              (&state->super_ValidationState<BlockValidationResult>,BLOCK_MUTATED,
                               (string *)local_c8,&local_58);
        local_e8._M_dataplus._M_p =
             (pointer)CONCAT17(local_58._M_dataplus._M_p._7_1_,
                               CONCAT16(local_58._M_dataplus._M_p._6_1_,
                                        CONCAT15(local_58._M_dataplus._M_p._5_1_,
                                                 CONCAT14(local_58._M_dataplus._M_p._4_1_,
                                                          CONCAT13(local_58._M_dataplus._M_p._3_1_,
                                                                   CONCAT12(local_58._M_dataplus.
                                                                            _M_p._2_1_,
                                                                            CONCAT11(local_58.
                                                  _M_dataplus._M_p._1_1_,
                                                  (char)local_58._M_dataplus._M_p)))))));
        local_e8.field_2._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_58.field_2) {
LAB_00b127ca:
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
    }
LAB_00b127eb:
    bVar17 = unaff_BPL;
    if (iVar14 != -1) goto LAB_00b128ce;
  }
  psVar16 = (block->vtx).
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar8 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar17 = 1;
  if (psVar16 != psVar8) {
    do {
      bVar1 = ((psVar16->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->m_has_witness;
      if (bVar1 == true) {
        local_c8._0_8_ = local_c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"unexpected-witness","");
        tinyformat::format<char[23]>
                  (&local_58,"%s : unexpected witness data found",
                   (char (*) [23])"CheckWitnessMalleation");
        unaff_BPL = ValidationState<BlockValidationResult>::Invalid
                              (&state->super_ValidationState<BlockValidationResult>,BLOCK_MUTATED,
                               (string *)local_c8,&local_58);
        puVar9 = (undefined1 *)
                 CONCAT17(local_58._M_dataplus._M_p._7_1_,
                          CONCAT16(local_58._M_dataplus._M_p._6_1_,
                                   CONCAT15(local_58._M_dataplus._M_p._5_1_,
                                            CONCAT14(local_58._M_dataplus._M_p._4_1_,
                                                     CONCAT13(local_58._M_dataplus._M_p._3_1_,
                                                              CONCAT12(local_58._M_dataplus._M_p.
                                                                       _2_1_,CONCAT11(local_58.
                                                  _M_dataplus._M_p._1_1_,
                                                  (char)local_58._M_dataplus._M_p)))))));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9 != &local_58.field_2) {
          operator_delete(puVar9,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
      }
      bVar17 = unaff_BPL;
    } while ((bVar1 == false) && (psVar16 = psVar16 + 1, bVar17 = 1, psVar16 != psVar8));
  }
LAB_00b128ce:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar17 & 1);
}

Assistant:

static bool CheckWitnessMalleation(const CBlock& block, bool expect_witness_commitment, BlockValidationState& state)
{
    if (expect_witness_commitment) {
        if (block.m_checked_witness_commitment) return true;

        int commitpos = GetWitnessCommitmentIndex(block);
        if (commitpos != NO_WITNESS_COMMITMENT) {
            assert(!block.vtx.empty() && !block.vtx[0]->vin.empty());
            const auto& witness_stack{block.vtx[0]->vin[0].scriptWitness.stack};

            if (witness_stack.size() != 1 || witness_stack[0].size() != 32) {
                return state.Invalid(
                    /*result=*/BlockValidationResult::BLOCK_MUTATED,
                    /*reject_reason=*/"bad-witness-nonce-size",
                    /*debug_message=*/strprintf("%s : invalid witness reserved value size", __func__));
            }

            // The malleation check is ignored; as the transaction tree itself
            // already does not permit it, it is impossible to trigger in the
            // witness tree.
            uint256 hash_witness = BlockWitnessMerkleRoot(block, /*mutated=*/nullptr);

            CHash256().Write(hash_witness).Write(witness_stack[0]).Finalize(hash_witness);
            if (memcmp(hash_witness.begin(), &block.vtx[0]->vout[commitpos].scriptPubKey[6], 32)) {
                return state.Invalid(
                    /*result=*/BlockValidationResult::BLOCK_MUTATED,
                    /*reject_reason=*/"bad-witness-merkle-match",
                    /*debug_message=*/strprintf("%s : witness merkle commitment mismatch", __func__));
            }

            block.m_checked_witness_commitment = true;
            return true;
        }
    }

    // No witness data is allowed in blocks that don't commit to witness data, as this would otherwise leave room for spam
    for (const auto& tx : block.vtx) {
        if (tx->HasWitness()) {
            return state.Invalid(
                /*result=*/BlockValidationResult::BLOCK_MUTATED,
                /*reject_reason=*/"unexpected-witness",
                /*debug_message=*/strprintf("%s : unexpected witness data found", __func__));
        }
    }

    return true;
}